

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week7-app4.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  allocator<char> local_79;
  _Vector_base<int,_std::allocator<int>_> local_78;
  undefined4 local_5f;
  undefined2 local_5b;
  undefined1 local_59;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [9];
  undefined4 local_37;
  undefined2 local_33;
  undefined1 local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"hello",&local_79);
  local_78._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50 = local_40;
  local_40[0] = 0;
  local_37 = local_5f;
  local_33 = local_5b;
  local_31 = local_59;
  local_48 = 0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    type_display< remove_modifiers<const int&>::type >();

    func2(5);
    func2(string("hello"));

    using K = decltype( func2(5) ); // unevaluated context
//    auto td = type_display< K >();

    auto v = std::vector<int>{};

    return 0;
}